

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  ostream *poVar1;
  char *pcVar2;
  bool attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  poVar1 = stream(this);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=\"");
  pcVar2 = "false";
  if (attribute) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\"");
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, bool attribute ) {
            stream() << " " << name << "=\"" << ( attribute ? "true" : "false" ) << "\"";
            return *this;
        }